

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode_io.c
# Opt level: O0

int CVodeGetNonlinSolvStats(void *cvode_mem,long *nniters,long *nnfails)

{
  undefined8 *in_RDX;
  undefined8 *in_RSI;
  long in_RDI;
  CVodeMem cv_mem;
  int local_4;
  
  if (in_RDI == 0) {
    cvProcessError((CVodeMem)0x0,-0x15,"CVODE","CVodeGetNonlinSolvStats","cvode_mem = NULL illegal."
                  );
    local_4 = -0x15;
  }
  else {
    *in_RSI = *(undefined8 *)(in_RDI + 0x370);
    *in_RDX = *(undefined8 *)(in_RDI + 0x378);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int CVodeGetNonlinSolvStats(void *cvode_mem, long int *nniters,
                            long int *nnfails)
{
  CVodeMem cv_mem;

  if (cvode_mem==NULL) {
    cvProcessError(NULL, CV_MEM_NULL, "CVODE",
                   "CVodeGetNonlinSolvStats", MSGCV_NO_MEM);
    return(CV_MEM_NULL);
  }

  cv_mem = (CVodeMem) cvode_mem;

  *nniters = cv_mem->cv_nni;
  *nnfails = cv_mem->cv_nnf;

  return(CV_SUCCESS);
}